

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O0

Normalizer2 *
icu_63::Normalizer2::getInstance
          (char *packageName,char *name,UNormalization2Mode mode,UErrorCode *errorCode)

{
  bool bVar1;
  UHashtable *hash;
  UBool UVar2;
  int iVar3;
  Norm2AllModes *pNVar4;
  Mutex MVar5;
  size_t sVar6;
  void *__dest;
  char *nameCopy;
  int32_t keyLength;
  void *temp;
  Mutex local_60;
  Mutex lock_1;
  LocalPointer<icu_63::Norm2AllModes> localAllModes;
  Mutex local_40;
  Mutex lock;
  Norm2AllModes *allModes;
  UErrorCode *errorCode_local;
  UNormalization2Mode mode_local;
  char *name_local;
  char *packageName_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 != '\0') {
    return (Normalizer2 *)0x0;
  }
  if ((name == (char *)0x0) || (*name == '\0')) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (Normalizer2 *)0x0;
  }
  lock.fMutex = (UMutex *)0x0;
  if (packageName == (char *)0x0) {
    iVar3 = strcmp(name,"nfc");
    if (iVar3 == 0) {
      lock.fMutex = (UMutex *)Norm2AllModes::getNFCInstance(errorCode);
    }
    else {
      iVar3 = strcmp(name,"nfkc");
      if (iVar3 == 0) {
        lock.fMutex = (UMutex *)Norm2AllModes::getNFKCInstance(errorCode);
      }
      else {
        iVar3 = strcmp(name,"nfkc_cf");
        if (iVar3 == 0) {
          lock.fMutex = (UMutex *)Norm2AllModes::getNFKC_CFInstance(errorCode);
        }
      }
    }
  }
  if ((lock.fMutex == (UMutex *)0x0) && (UVar2 = ::U_SUCCESS(*errorCode), UVar2 != '\0')) {
    Mutex::Mutex(&local_40,(UMutex *)0x0);
    if (cache != (UHashtable *)0x0) {
      lock.fMutex = (UMutex *)uhash_get_63(cache,name);
    }
    Mutex::~Mutex(&local_40);
    if (lock.fMutex == (UMutex *)0x0) {
      ucln_common_registerCleanup_63(UCLN_COMMON_LOADED_NORMALIZER2,uprv_loaded_normalizer2_cleanup)
      ;
      pNVar4 = Norm2AllModes::createInstance(packageName,name,errorCode);
      LocalPointer<icu_63::Norm2AllModes>::LocalPointer
                ((LocalPointer<icu_63::Norm2AllModes> *)&lock_1,pNVar4);
      UVar2 = ::U_SUCCESS(*errorCode);
      if (UVar2 == '\0') {
LAB_0022bc9e:
        bVar1 = false;
      }
      else {
        Mutex::Mutex(&local_60,(UMutex *)0x0);
        if (cache == (UHashtable *)0x0) {
          cache = uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,errorCode
                               );
          UVar2 = ::U_FAILURE(*errorCode);
          if (UVar2 == '\0') {
            uhash_setKeyDeleter_63(cache,uprv_free_63);
            uhash_setValueDeleter_63(cache,deleteNorm2AllModes);
            goto LAB_0022bb81;
          }
          packageName_local = (char *)0x0;
          bVar1 = true;
        }
        else {
LAB_0022bb81:
          MVar5.fMutex = (UMutex *)uhash_get_63(cache,name);
          if (MVar5.fMutex == (UMutex *)0x0) {
            sVar6 = strlen(name);
            iVar3 = (int)sVar6 + 1;
            __dest = uprv_malloc_63((long)iVar3);
            if (__dest == (void *)0x0) {
              *errorCode = U_MEMORY_ALLOCATION_ERROR;
              packageName_local = (char *)0x0;
              bVar1 = true;
              goto LAB_0022bc8a;
            }
            memcpy(__dest,name,(long)iVar3);
            lock.fMutex = (UMutex *)
                          LocalPointerBase<icu_63::Norm2AllModes>::getAlias
                                    ((LocalPointerBase<icu_63::Norm2AllModes> *)&lock_1);
            hash = cache;
            pNVar4 = LocalPointerBase<icu_63::Norm2AllModes>::orphan
                               ((LocalPointerBase<icu_63::Norm2AllModes> *)&lock_1);
            uhash_put_63(hash,__dest,pNVar4,errorCode);
            MVar5 = lock;
          }
          lock.fMutex = MVar5.fMutex;
          bVar1 = false;
        }
LAB_0022bc8a:
        Mutex::~Mutex(&local_60);
        if (!bVar1) goto LAB_0022bc9e;
      }
      LocalPointer<icu_63::Norm2AllModes>::~LocalPointer
                ((LocalPointer<icu_63::Norm2AllModes> *)&lock_1);
      if (bVar1) {
        return (Normalizer2 *)packageName_local;
      }
    }
  }
  if ((lock.fMutex == (UMutex *)0x0) || (UVar2 = ::U_SUCCESS(*errorCode), UVar2 == '\0')) {
switchD_0022bd09_default:
    packageName_local = (char *)0x0;
  }
  else {
    switch(mode) {
    case UNORM2_COMPOSE:
      packageName_local = ((lock.fMutex)->fMutex).__size + 8;
      break;
    case UNORM2_DECOMPOSE:
      packageName_local = ((lock.fMutex)->fMutex).__size + 0x20;
      break;
    case UNORM2_FCD:
      packageName_local = lock.fMutex[1].fMutex.__size + 8;
      break;
    case UNORM2_COMPOSE_CONTIGUOUS:
      packageName_local = lock.fMutex[1].fMutex.__size + 0x18;
      break;
    default:
      goto switchD_0022bd09_default;
    }
  }
  return (Normalizer2 *)packageName_local;
}

Assistant:

const Normalizer2 *
Normalizer2::getInstance(const char *packageName,
                         const char *name,
                         UNormalization2Mode mode,
                         UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    if(name==NULL || *name==0) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    const Norm2AllModes *allModes=NULL;
    if(packageName==NULL) {
        if(0==uprv_strcmp(name, "nfc")) {
            allModes=Norm2AllModes::getNFCInstance(errorCode);
        } else if(0==uprv_strcmp(name, "nfkc")) {
            allModes=Norm2AllModes::getNFKCInstance(errorCode);
        } else if(0==uprv_strcmp(name, "nfkc_cf")) {
            allModes=Norm2AllModes::getNFKC_CFInstance(errorCode);
        }
    }
    if(allModes==NULL && U_SUCCESS(errorCode)) {
        {
            Mutex lock;
            if(cache!=NULL) {
                allModes=(Norm2AllModes *)uhash_get(cache, name);
            }
        }
        if(allModes==NULL) {
            ucln_common_registerCleanup(UCLN_COMMON_LOADED_NORMALIZER2, uprv_loaded_normalizer2_cleanup);
            LocalPointer<Norm2AllModes> localAllModes(
                Norm2AllModes::createInstance(packageName, name, errorCode));
            if(U_SUCCESS(errorCode)) {
                Mutex lock;
                if(cache==NULL) {
                    cache=uhash_open(uhash_hashChars, uhash_compareChars, NULL, &errorCode);
                    if(U_FAILURE(errorCode)) {
                        return NULL;
                    }
                    uhash_setKeyDeleter(cache, uprv_free);
                    uhash_setValueDeleter(cache, deleteNorm2AllModes);
                }
                void *temp=uhash_get(cache, name);
                if(temp==NULL) {
                    int32_t keyLength= static_cast<int32_t>(uprv_strlen(name)+1);
                    char *nameCopy=(char *)uprv_malloc(keyLength);
                    if(nameCopy==NULL) {
                        errorCode=U_MEMORY_ALLOCATION_ERROR;
                        return NULL;
                    }
                    uprv_memcpy(nameCopy, name, keyLength);
                    allModes=localAllModes.getAlias();
                    uhash_put(cache, nameCopy, localAllModes.orphan(), &errorCode);
                } else {
                    // race condition
                    allModes=(Norm2AllModes *)temp;
                }
            }
        }
    }
    if(allModes!=NULL && U_SUCCESS(errorCode)) {
        switch(mode) {
        case UNORM2_COMPOSE:
            return &allModes->comp;
        case UNORM2_DECOMPOSE:
            return &allModes->decomp;
        case UNORM2_FCD:
            return &allModes->fcd;
        case UNORM2_COMPOSE_CONTIGUOUS:
            return &allModes->fcc;
        default:
            break;  // do nothing
        }
    }
    return NULL;
}